

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O3

bool util::is_valid_player_name(char *str,size_t len,bool allow_empty)

{
  int iVar1;
  bool bVar2;
  size_t sVar3;
  
  if ((len < 0x41) && ((allow_empty || ((str != (char *)0x0 && (*str != '0')))))) {
    bVar2 = true;
    if (len != 0) {
      sVar3 = 0;
      do {
        if ((str[sVar3] == 0x20) || (iVar1 = isprint((int)str[sVar3]), iVar1 == 0))
        goto LAB_0010792f;
        sVar3 = sVar3 + 1;
      } while (len != sVar3);
    }
  }
  else {
LAB_0010792f:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool is_valid_player_name(const char* str, size_t len, bool allow_empty/* = true*/)
{
	constexpr size_t max_name_len = 64;
	if (len > max_name_len)
		return false;

	if (!allow_empty && (str == nullptr || *str == '0'))
		return false;

	for (size_t i = 0; i < len; ++i)
		if (str[i] == ' ' || !isprint(str[i]))
			return false;

	return true;
}